

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O3

void iutest::TestEnv::set_test_filter(char *str)

{
  char *pcVar1;
  Variable *pVVar2;
  TestFlag *pTVar3;
  char *__s;
  
  __s = "*";
  if (str != (char *)0x0) {
    __s = str;
  }
  pVVar2 = get_vars();
  pcVar1 = (char *)(pVVar2->m_test_filter)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&pVVar2->m_test_filter,0,pcVar1,(ulong)__s);
  pTVar3 = TestFlag::GetInstance();
  *(byte *)&pTVar3->m_test_flags = (byte)pTVar3->m_test_flags | 4;
  TestFlag::GetInstance();
  return;
}

Assistant:

static void set_test_filter(const char* str)
    {
        get_vars().m_test_filter = str == NULL ? "*" : str;
        TestFlag::SetFlag(TestFlag::FILTERING_TESTS);
    }